

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::PostfixUnaryExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  local_1 = kind == PostdecrementExpression || kind == PostincrementExpression;
  return local_1;
}

Assistant:

bool PostfixUnaryExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PostdecrementExpression:
        case SyntaxKind::PostincrementExpression:
            return true;
        default:
            return false;
    }
}